

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O2

void ncnn::pack_A_tile_quantize(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk,Mat *scales)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  long lVar6;
  long lVar7;
  void *pvVar8;
  void *pvVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int kk;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  float *pfVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  undefined8 *puVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  undefined8 *puVar41;
  undefined1 (*pauVar42) [32];
  long lVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar71;
  float fVar93;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar91;
  float fVar92;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 in_ZMM8 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar98 [16];
  float fVar97;
  float fVar108;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar106;
  float fVar107;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 in_ZMM9 [64];
  undefined1 auVar105 [64];
  long local_118;
  size_t *psVar24;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  
  iVar21 = cpu_support_x86_avx_vnni_int8();
  if (iVar21 != 0) {
    pack_A_tile_fp32_to_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk,scales);
    return;
  }
  iVar21 = cpu_support_x86_avx_vnni();
  if (iVar21 == 0) {
    iVar21 = cpu_support_x86_avx2();
    auVar46 = _DAT_005430b0;
    if (iVar21 == 0) {
      iVar21 = A->elempack;
      psVar24 = (size_t *)&A->w;
      if (A->dims == 3) {
        psVar24 = &A->cstep;
      }
      iVar28 = (int)*psVar24;
      lVar23 = (long)iVar28;
      lVar35 = (long)(iVar21 * k);
      lVar40 = (long)i;
      lVar25 = (long)(iVar28 * 4);
      lVar33 = (long)k;
      lVar34 = lVar33 * 4 + lVar23 * lVar40 * 4;
      local_118 = lVar35 * 4 + lVar23 * lVar40 * 4;
      iVar22 = iVar28 * 7;
      lVar26 = (long)max_ii;
      lVar27 = lVar23 * 0x20;
      lVar36 = (lVar40 * 4 + 4) * lVar23 + lVar33 * 4;
      lVar43 = (long)(iVar28 * 6) * 4;
      lVar38 = (long)(iVar28 * 3 + 1) * 4;
      lVar2 = (long)(iVar28 * 2) * 4;
      lVar29 = (long)(iVar28 * 2) * 4;
      lVar6 = (long)(iVar28 + 1) * 4;
      auVar47._8_4_ = 0x80000000;
      auVar47._0_8_ = 0x8000000080000000;
      auVar47._12_4_ = 0x80000000;
      auVar47._16_4_ = 0x80000000;
      auVar47._20_4_ = 0x80000000;
      auVar47._24_4_ = 0x80000000;
      auVar47._28_4_ = 0x80000000;
      lVar7 = (long)(iVar28 * 3) * 4;
      auVar49._8_4_ = 0x3f000000;
      auVar49._0_8_ = 0x3f0000003f000000;
      auVar49._12_4_ = 0x3f000000;
      auVar49._16_4_ = 0x3f000000;
      auVar49._20_4_ = 0x3f000000;
      auVar49._24_4_ = 0x3f000000;
      auVar49._28_4_ = 0x3f000000;
      auVar50._8_4_ = 0x7f007f;
      auVar50._0_8_ = 0x7f007f007f007f;
      auVar50._12_4_ = 0x7f007f;
      auVar52._8_4_ = 0xff81ff81;
      auVar52._0_8_ = 0xff81ff81ff81ff81;
      auVar52._12_4_ = 0xff81ff81;
      auVar44._8_4_ = 0x7f007f;
      auVar44._0_8_ = 0x7f007f007f007f;
      auVar44._12_4_ = 0x7f007f;
      auVar45._8_4_ = 0xff81ff81;
      auVar45._0_8_ = 0xff81ff81ff81ff81;
      auVar45._12_4_ = 0xff81ff81;
      lVar3 = lVar23 * 4;
      puVar41 = (undefined8 *)AT->data;
      for (uVar39 = 0; (long)(uVar39 | 7) < lVar26; uVar39 = uVar39 + 8) {
        puVar37 = (undefined8 *)((long)puVar41 + (long)(max_kk * 4));
        pvVar8 = A->data;
        pauVar42 = (undefined1 (*) [32])((long)pvVar8 + lVar35 * 4 + (uVar39 + lVar40) * lVar23 * 4)
        ;
        auVar102 = *(undefined1 (*) [32])((long)scales->data + uVar39 * 4 + lVar40 * 4);
        fVar4 = auVar102._0_4_;
        fVar5 = auVar102._4_4_;
        fVar14 = auVar102._8_4_;
        fVar10 = auVar102._12_4_;
        fVar11 = auVar102._16_4_;
        fVar12 = auVar102._20_4_;
        fVar13 = auVar102._24_4_;
        if (iVar21 == 8) {
          lVar30 = 0;
          for (iVar32 = 0; iVar32 + 1 < max_kk; iVar32 = iVar32 + 2) {
            pfVar31 = (float *)((long)pvVar8 + lVar30 * 8 + local_118);
            auVar89._0_4_ = fVar4 * *pfVar31;
            auVar89._4_4_ = fVar5 * pfVar31[1];
            auVar89._8_4_ = fVar14 * pfVar31[2];
            auVar89._12_4_ = fVar10 * pfVar31[3];
            auVar89._16_4_ = fVar11 * pfVar31[4];
            auVar89._20_4_ = fVar12 * pfVar31[5];
            auVar89._28_36_ = in_ZMM8._28_36_;
            auVar89._24_4_ = fVar13 * pfVar31[6];
            pfVar31 = (float *)((long)pvVar8 + lVar30 * 8 + local_118 + 0x20);
            auVar105._0_4_ = fVar4 * *pfVar31;
            auVar105._4_4_ = fVar5 * pfVar31[1];
            auVar105._8_4_ = fVar14 * pfVar31[2];
            auVar105._12_4_ = fVar10 * pfVar31[3];
            auVar105._16_4_ = fVar11 * pfVar31[4];
            auVar105._20_4_ = fVar12 * pfVar31[5];
            auVar105._28_36_ = in_ZMM9._28_36_;
            auVar105._24_4_ = fVar13 * pfVar31[6];
            auVar102 = vandps_avx(auVar89._0_32_,auVar47);
            auVar84 = vandps_avx(auVar105._0_32_,auVar47);
            auVar102 = vorps_avx(auVar102,auVar49);
            auVar84 = vorps_avx(auVar84,auVar49);
            auVar72._0_4_ = (int)(auVar89._0_4_ + auVar102._0_4_);
            auVar72._4_4_ = (int)(auVar89._4_4_ + auVar102._4_4_);
            auVar72._8_4_ = (int)(auVar89._8_4_ + auVar102._8_4_);
            auVar72._12_4_ = (int)(auVar89._12_4_ + auVar102._12_4_);
            auVar83._16_4_ = (int)(auVar89._16_4_ + auVar102._16_4_);
            auVar83._0_16_ = auVar72;
            auVar83._20_4_ = (int)(auVar89._20_4_ + auVar102._20_4_);
            auVar83._24_4_ = (int)(auVar89._24_4_ + auVar102._24_4_);
            auVar83._28_4_ = (int)(in_ZMM8._28_4_ + auVar102._28_4_);
            auVar98._0_4_ = (int)(auVar105._0_4_ + auVar84._0_4_);
            auVar98._4_4_ = (int)(auVar105._4_4_ + auVar84._4_4_);
            auVar98._8_4_ = (int)(auVar105._8_4_ + auVar84._8_4_);
            auVar98._12_4_ = (int)(auVar105._12_4_ + auVar84._12_4_);
            auVar102._16_4_ = (int)(auVar105._16_4_ + auVar84._16_4_);
            auVar102._0_16_ = auVar98;
            auVar102._20_4_ = (int)(auVar105._20_4_ + auVar84._20_4_);
            auVar102._24_4_ = (int)(auVar105._24_4_ + auVar84._24_4_);
            auVar102._28_4_ = (int)(in_ZMM9._28_4_ + auVar84._28_4_);
            auVar72 = vpackssdw_avx(auVar72,auVar83._16_16_);
            auVar98 = vpackssdw_avx(auVar98,auVar102._16_16_);
            auVar72 = vpminsw_avx(auVar72,auVar50);
            auVar98 = vpminsw_avx(auVar98,auVar50);
            auVar72 = vpmaxsw_avx(auVar72,auVar52);
            auVar98 = vpmaxsw_avx(auVar98,auVar52);
            in_ZMM9 = ZEXT1664(auVar98);
            auVar72 = vpacksswb_avx(auVar72,auVar98);
            auVar72 = vpshufb_avx(auVar72,auVar46);
            *(long *)((long)puVar41 + lVar30) = auVar72._0_8_;
            auVar72 = vpshufd_avx(auVar72,0x4e);
            in_ZMM8 = ZEXT1664(auVar72);
            *(long *)((long)puVar37 + lVar30) = auVar72._0_8_;
            pauVar42 = pauVar42 + 2;
            lVar30 = lVar30 + 8;
          }
          for (; iVar32 < max_kk; iVar32 = iVar32 + 1) {
            pfVar31 = (float *)((long)pvVar8 + lVar30 * 8 + local_118);
            auVar90._0_4_ = fVar4 * *pfVar31;
            auVar90._4_4_ = fVar5 * pfVar31[1];
            auVar90._8_4_ = fVar14 * pfVar31[2];
            auVar90._12_4_ = fVar10 * pfVar31[3];
            auVar90._16_4_ = fVar11 * pfVar31[4];
            auVar90._20_4_ = fVar12 * pfVar31[5];
            auVar90._28_36_ = in_ZMM8._28_36_;
            auVar90._24_4_ = fVar13 * pfVar31[6];
            auVar102 = vandps_avx(auVar90._0_32_,auVar47);
            auVar102 = vorps_avx(auVar102,auVar49);
            auVar73._0_4_ = (int)(auVar90._0_4_ + auVar102._0_4_);
            auVar73._4_4_ = (int)(auVar90._4_4_ + auVar102._4_4_);
            auVar73._8_4_ = (int)(auVar90._8_4_ + auVar102._8_4_);
            auVar73._12_4_ = (int)(auVar90._12_4_ + auVar102._12_4_);
            auVar84._16_4_ = (int)(auVar90._16_4_ + auVar102._16_4_);
            auVar84._0_16_ = auVar73;
            auVar84._20_4_ = (int)(auVar90._20_4_ + auVar102._20_4_);
            auVar84._24_4_ = (int)(auVar90._24_4_ + auVar102._24_4_);
            auVar84._28_4_ = (int)(in_ZMM8._28_4_ + auVar102._28_4_);
            in_ZMM9 = ZEXT1664(auVar84._16_16_);
            auVar72 = vpackssdw_avx(auVar73,auVar84._16_16_);
            auVar72 = vpminsw_avx(auVar72,auVar44);
            auVar72 = vpmaxsw_avx(auVar72,auVar45);
            auVar72 = vpacksswb_avx(auVar72,auVar72);
            in_ZMM8 = ZEXT1664(auVar72);
            *(int *)((long)puVar41 + lVar30) = auVar72._0_4_;
            *(int *)((long)puVar37 + lVar30) = auVar72._4_4_;
            pauVar42 = pauVar42 + 1;
            lVar30 = lVar30 + 4;
          }
          puVar37 = (undefined8 *)((long)puVar37 + lVar30);
          puVar41 = (undefined8 *)((long)puVar41 + lVar30);
        }
        if (iVar21 == 4) {
          for (iVar32 = 0; iVar32 + 1 < max_kk; iVar32 = iVar32 + 2) {
            auVar102 = *pauVar42;
            auVar72 = *(undefined1 (*) [16])(*pauVar42 + lVar25 * 4);
            auVar83 = vperm2f128_avx(auVar102,*(undefined1 (*) [32])(*pauVar42 + lVar25 * 4),0x31);
            fVar97 = auVar102._0_4_ * fVar4;
            fVar106 = auVar102._4_4_ * fVar5;
            auVar15._4_4_ = fVar106;
            auVar15._0_4_ = fVar97;
            fVar107 = auVar102._8_4_ * fVar14;
            auVar15._8_4_ = fVar107;
            fVar108 = auVar102._12_4_ * fVar10;
            auVar15._12_4_ = fVar108;
            fVar109 = auVar72._0_4_ * fVar11;
            auVar15._16_4_ = fVar109;
            fVar110 = auVar72._4_4_ * fVar12;
            auVar15._20_4_ = fVar110;
            fVar111 = auVar72._8_4_ * fVar13;
            auVar15._24_4_ = fVar111;
            auVar15._28_4_ = auVar72._12_4_;
            fVar71 = auVar83._0_4_ * fVar4;
            fVar91 = auVar83._4_4_ * fVar5;
            auVar16._4_4_ = fVar91;
            auVar16._0_4_ = fVar71;
            fVar92 = auVar83._8_4_ * fVar14;
            auVar16._8_4_ = fVar92;
            fVar93 = auVar83._12_4_ * fVar10;
            auVar16._12_4_ = fVar93;
            fVar94 = auVar83._16_4_ * fVar11;
            auVar16._16_4_ = fVar94;
            fVar95 = auVar83._20_4_ * fVar12;
            auVar16._20_4_ = fVar95;
            fVar96 = auVar83._24_4_ * fVar13;
            auVar16._24_4_ = fVar96;
            auVar16._28_4_ = auVar83._28_4_;
            auVar102 = vandps_avx(auVar15,auVar47);
            auVar84 = vandps_avx(auVar16,auVar47);
            auVar102 = vorps_avx(auVar102,auVar49);
            auVar84 = vorps_avx(auVar84,auVar49);
            auVar99._0_4_ = (int)(fVar97 + auVar102._0_4_);
            auVar99._4_4_ = (int)(fVar106 + auVar102._4_4_);
            auVar99._8_4_ = (int)(fVar107 + auVar102._8_4_);
            auVar99._12_4_ = (int)(fVar108 + auVar102._12_4_);
            auVar103._16_4_ = (int)(fVar109 + auVar102._16_4_);
            auVar103._0_16_ = auVar99;
            auVar103._20_4_ = (int)(fVar110 + auVar102._20_4_);
            auVar103._24_4_ = (int)(fVar111 + auVar102._24_4_);
            auVar103._28_4_ = (int)(auVar72._12_4_ + auVar102._28_4_);
            auVar74._0_4_ = (int)(fVar71 + auVar84._0_4_);
            auVar74._4_4_ = (int)(fVar91 + auVar84._4_4_);
            auVar74._8_4_ = (int)(fVar92 + auVar84._8_4_);
            auVar74._12_4_ = (int)(fVar93 + auVar84._12_4_);
            auVar85._16_4_ = (int)(fVar94 + auVar84._16_4_);
            auVar85._0_16_ = auVar74;
            auVar85._20_4_ = (int)(fVar95 + auVar84._20_4_);
            auVar85._24_4_ = (int)(fVar96 + auVar84._24_4_);
            auVar85._28_4_ = (int)(auVar83._28_4_ + auVar84._28_4_);
            auVar72 = vpackssdw_avx(auVar99,auVar103._16_16_);
            auVar98 = vpackssdw_avx(auVar74,auVar85._16_16_);
            auVar72 = vpminsw_avx(auVar72,auVar50);
            auVar98 = vpminsw_avx(auVar98,auVar50);
            auVar72 = vpmaxsw_avx(auVar72,auVar52);
            in_ZMM9 = ZEXT1664(auVar72);
            auVar98 = vpmaxsw_avx(auVar98,auVar52);
            auVar72 = vpacksswb_avx(auVar72,auVar98);
            auVar72 = vpshufb_avx(auVar72,auVar46);
            *puVar41 = auVar72._0_8_;
            auVar72 = vpshufd_avx(auVar72,0x4e);
            in_ZMM8 = ZEXT1664(auVar72);
            *puVar37 = auVar72._0_8_;
            puVar41 = puVar41 + 1;
            puVar37 = puVar37 + 1;
            pauVar42 = pauVar42 + 1;
          }
          for (; iVar32 < max_kk; iVar32 = iVar32 + 1) {
            fVar71 = *(float *)*pauVar42 * fVar4;
            fVar91 = *(float *)(*pauVar42 + 4) * fVar5;
            auVar17._4_4_ = fVar91;
            auVar17._0_4_ = fVar71;
            fVar92 = *(float *)(*pauVar42 + 8) * fVar14;
            auVar17._8_4_ = fVar92;
            fVar93 = *(float *)(*pauVar42 + 0xc) * fVar10;
            auVar17._12_4_ = fVar93;
            fVar94 = *(float *)(*pauVar42 + lVar25 * 4 + 0x10) * fVar11;
            auVar17._16_4_ = fVar94;
            fVar95 = *(float *)(*pauVar42 + lVar25 * 4 + 0x14) * fVar12;
            auVar17._20_4_ = fVar95;
            fVar96 = *(float *)(*pauVar42 + lVar25 * 4 + 0x18) * fVar13;
            auVar17._24_4_ = fVar96;
            auVar17._28_4_ = *(float *)(*pauVar42 + lVar25 * 4 + 0x1c);
            auVar102 = vandps_avx(auVar17,auVar47);
            auVar102 = vorps_avx(auVar102,auVar49);
            auVar75._0_4_ = (int)(fVar71 + auVar102._0_4_);
            auVar75._4_4_ = (int)(fVar91 + auVar102._4_4_);
            auVar75._8_4_ = (int)(fVar92 + auVar102._8_4_);
            auVar75._12_4_ = (int)(fVar93 + auVar102._12_4_);
            auVar86._16_4_ = (int)(fVar94 + auVar102._16_4_);
            auVar86._0_16_ = auVar75;
            auVar86._20_4_ = (int)(fVar95 + auVar102._20_4_);
            auVar86._24_4_ = (int)(fVar96 + auVar102._24_4_);
            auVar86._28_4_ = (int)(*(float *)(*pauVar42 + lVar25 * 4 + 0x1c) + auVar102._28_4_);
            in_ZMM9 = ZEXT1664(auVar86._16_16_);
            auVar72 = vpackssdw_avx(auVar75,auVar86._16_16_);
            auVar72 = vpminsw_avx(auVar72,auVar44);
            auVar72 = vpmaxsw_avx(auVar72,auVar45);
            auVar72 = vpacksswb_avx(auVar72,auVar72);
            in_ZMM8 = ZEXT1664(auVar72);
            *(int *)puVar41 = auVar72._0_4_;
            *(int *)puVar37 = auVar72._4_4_;
            puVar41 = (undefined8 *)((long)puVar41 + 4);
            puVar37 = (undefined8 *)((long)puVar37 + 4);
            pauVar42 = (undefined1 (*) [32])(*pauVar42 + 0x10);
          }
        }
        if (iVar21 == 1) {
          lVar30 = 0;
          for (iVar32 = 0; iVar32 + 1 < max_kk; iVar32 = iVar32 + 2) {
            auVar72 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar42 + lVar30 + lVar25 * 4)),
                                    ZEXT416(*(uint *)(*pauVar42 + lVar30 + (long)(iVar28 * 5) * 4)),
                                    0x10);
            auVar72 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(*pauVar42 + lVar30 + lVar43)),0x20);
            auVar72 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(*pauVar42 + lVar30 + (long)iVar22 * 4)
                                                   ),0x30);
            auVar98 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar42 + lVar30)),
                                    ZEXT416(*(uint *)(*pauVar42 + lVar30 + lVar3)),0x10);
            auVar98 = vinsertps_avx(auVar98,ZEXT416(*(uint *)(*pauVar42 + lVar30 + lVar2)),0x20);
            auVar98 = vinsertps_avx(auVar98,ZEXT416(*(uint *)(*pauVar42 + lVar30 + lVar7)),0x30);
            auVar73 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar42 + lVar30 + lVar25 * 4 + 4)),
                                    ZEXT416(*(uint *)(*pauVar42 +
                                                     lVar30 + (long)(iVar28 * 5 + 1) * 4)),0x10);
            auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(*pauVar42 + lVar30 + lVar43 + 4)),0x20
                                   );
            auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(*pauVar42 +
                                                             lVar30 + (long)(iVar22 + 1) * 4)),0x30)
            ;
            auVar74 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar42 + lVar30 + 4)),
                                    ZEXT416(*(uint *)(*pauVar42 + lVar30 + lVar6)),0x10);
            auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(*pauVar42 + lVar30 + lVar2 + 4)),0x20)
            ;
            auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(*pauVar42 + lVar30 + lVar38)),0x30);
            fVar71 = auVar98._0_4_ * fVar4;
            fVar91 = auVar98._4_4_ * fVar5;
            auVar18._4_4_ = fVar91;
            auVar18._0_4_ = fVar71;
            fVar92 = auVar98._8_4_ * fVar14;
            auVar18._8_4_ = fVar92;
            fVar93 = auVar98._12_4_ * fVar10;
            auVar18._12_4_ = fVar93;
            fVar94 = auVar72._0_4_ * fVar11;
            auVar18._16_4_ = fVar94;
            fVar95 = auVar72._4_4_ * fVar12;
            auVar18._20_4_ = fVar95;
            fVar96 = auVar72._8_4_ * fVar13;
            auVar18._24_4_ = fVar96;
            auVar18._28_4_ = auVar72._12_4_;
            fVar97 = auVar74._0_4_ * fVar4;
            fVar106 = auVar74._4_4_ * fVar5;
            auVar19._4_4_ = fVar106;
            auVar19._0_4_ = fVar97;
            fVar107 = auVar74._8_4_ * fVar14;
            auVar19._8_4_ = fVar107;
            fVar108 = auVar74._12_4_ * fVar10;
            auVar19._12_4_ = fVar108;
            fVar109 = auVar73._0_4_ * fVar11;
            auVar19._16_4_ = fVar109;
            fVar110 = auVar73._4_4_ * fVar12;
            auVar19._20_4_ = fVar110;
            fVar111 = auVar73._8_4_ * fVar13;
            auVar19._24_4_ = fVar111;
            auVar19._28_4_ = auVar73._12_4_;
            auVar102 = vandps_avx(auVar18,auVar47);
            auVar84 = vandps_avx(auVar19,auVar47);
            auVar102 = vorps_avx(auVar102,auVar49);
            auVar84 = vorps_avx(auVar84,auVar49);
            auVar76._0_4_ = (int)(fVar71 + auVar102._0_4_);
            auVar76._4_4_ = (int)(fVar91 + auVar102._4_4_);
            auVar76._8_4_ = (int)(fVar92 + auVar102._8_4_);
            auVar76._12_4_ = (int)(fVar93 + auVar102._12_4_);
            auVar87._16_4_ = (int)(fVar94 + auVar102._16_4_);
            auVar87._0_16_ = auVar76;
            auVar87._20_4_ = (int)(fVar95 + auVar102._20_4_);
            auVar87._24_4_ = (int)(fVar96 + auVar102._24_4_);
            auVar87._28_4_ = (int)(auVar72._12_4_ + auVar102._28_4_);
            auVar100._0_4_ = (int)(fVar97 + auVar84._0_4_);
            auVar100._4_4_ = (int)(fVar106 + auVar84._4_4_);
            auVar100._8_4_ = (int)(fVar107 + auVar84._8_4_);
            auVar100._12_4_ = (int)(fVar108 + auVar84._12_4_);
            auVar104._16_4_ = (int)(fVar109 + auVar84._16_4_);
            auVar104._0_16_ = auVar100;
            auVar104._20_4_ = (int)(fVar110 + auVar84._20_4_);
            auVar104._24_4_ = (int)(fVar111 + auVar84._24_4_);
            auVar104._28_4_ = (int)(auVar73._12_4_ + auVar84._28_4_);
            auVar72 = vpackssdw_avx(auVar76,auVar87._16_16_);
            auVar98 = vpackssdw_avx(auVar100,auVar104._16_16_);
            auVar72 = vpminsw_avx(auVar72,auVar50);
            auVar98 = vpminsw_avx(auVar98,auVar50);
            auVar72 = vpmaxsw_avx(auVar72,auVar52);
            auVar98 = vpmaxsw_avx(auVar98,auVar52);
            in_ZMM9 = ZEXT1664(auVar98);
            auVar72 = vpacksswb_avx(auVar72,auVar98);
            auVar72 = vpshufb_avx(auVar72,auVar46);
            *(long *)((long)puVar41 + lVar30) = auVar72._0_8_;
            auVar72 = vpshufd_avx(auVar72,0x4e);
            in_ZMM8 = ZEXT1664(auVar72);
            *(long *)((long)puVar37 + lVar30) = auVar72._0_8_;
            lVar30 = lVar30 + 8;
          }
          for (; iVar32 < max_kk; iVar32 = iVar32 + 1) {
            auVar72 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar42 + lVar30 + lVar25 * 4)),
                                    ZEXT416(*(uint *)(*pauVar42 + lVar30 + (long)(iVar28 * 5) * 4)),
                                    0x10);
            auVar72 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(*pauVar42 +
                                                             lVar30 + (long)(iVar28 * 6) * 4)),0x20)
            ;
            auVar72 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(*pauVar42 + lVar30 + (long)iVar22 * 4)
                                                   ),0x30);
            auVar98 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar42 + lVar30)),
                                    ZEXT416(*(uint *)(*pauVar42 + lVar30 + lVar3)),0x10);
            auVar98 = vinsertps_avx(auVar98,ZEXT416(*(uint *)(*pauVar42 + lVar30 + lVar29)),0x20);
            auVar98 = vinsertps_avx(auVar98,ZEXT416(*(uint *)(*pauVar42 + lVar30 + lVar7)),0x30);
            fVar71 = auVar98._0_4_ * fVar4;
            fVar91 = auVar98._4_4_ * fVar5;
            auVar20._4_4_ = fVar91;
            auVar20._0_4_ = fVar71;
            fVar92 = auVar98._8_4_ * fVar14;
            auVar20._8_4_ = fVar92;
            fVar93 = auVar98._12_4_ * fVar10;
            auVar20._12_4_ = fVar93;
            fVar94 = auVar72._0_4_ * fVar11;
            auVar20._16_4_ = fVar94;
            fVar95 = auVar72._4_4_ * fVar12;
            auVar20._20_4_ = fVar95;
            fVar96 = auVar72._8_4_ * fVar13;
            auVar20._24_4_ = fVar96;
            auVar20._28_4_ = auVar72._12_4_;
            auVar102 = vandps_avx(auVar20,auVar47);
            auVar102 = vorps_avx(auVar102,auVar49);
            auVar77._0_4_ = (int)(fVar71 + auVar102._0_4_);
            auVar77._4_4_ = (int)(fVar91 + auVar102._4_4_);
            auVar77._8_4_ = (int)(fVar92 + auVar102._8_4_);
            auVar77._12_4_ = (int)(fVar93 + auVar102._12_4_);
            auVar88._16_4_ = (int)(fVar94 + auVar102._16_4_);
            auVar88._0_16_ = auVar77;
            auVar88._20_4_ = (int)(fVar95 + auVar102._20_4_);
            auVar88._24_4_ = (int)(fVar96 + auVar102._24_4_);
            auVar88._28_4_ = (int)(auVar72._12_4_ + auVar102._28_4_);
            in_ZMM9 = ZEXT1664(auVar88._16_16_);
            auVar72 = vpackssdw_avx(auVar77,auVar88._16_16_);
            auVar72 = vpminsw_avx(auVar72,auVar44);
            auVar72 = vpmaxsw_avx(auVar72,auVar45);
            auVar72 = vpacksswb_avx(auVar72,auVar72);
            in_ZMM8 = ZEXT1664(auVar72);
            *(int *)((long)puVar41 + lVar30) = auVar72._0_4_;
            *(int *)((long)puVar37 + lVar30) = auVar72._4_4_;
            lVar30 = lVar30 + 4;
          }
          puVar37 = (undefined8 *)((long)puVar37 + lVar30);
        }
        lVar34 = lVar34 + lVar27;
        lVar36 = lVar36 + lVar27;
        local_118 = local_118 + lVar27;
        puVar41 = puVar37;
      }
      pvVar8 = A->data;
      pvVar9 = scales->data;
      lVar43 = lVar23 * 0x10;
      local_118 = local_118 + (long)pvVar8;
      auVar46._8_4_ = 0x80000000;
      auVar46._0_8_ = 0x8000000080000000;
      auVar46._12_4_ = 0x80000000;
      auVar48._8_4_ = 0x3f000000;
      auVar48._0_8_ = 0x3f0000003f000000;
      auVar48._12_4_ = 0x3f000000;
      for (; (long)(uVar39 | 3) < lVar26; uVar39 = uVar39 + 4) {
        pfVar31 = (float *)((long)pvVar8 + (uVar39 + lVar40) * lVar23 * 4 + lVar35 * 4);
        pfVar1 = (float *)((long)pvVar9 + uVar39 * 4 + lVar40 * 4);
        fVar4 = *pfVar1;
        fVar5 = pfVar1[1];
        fVar14 = pfVar1[2];
        fVar10 = pfVar1[3];
        if (iVar21 == 4) {
          lVar25 = 0;
          for (iVar28 = 0; iVar28 + 1 < max_kk; iVar28 = iVar28 + 2) {
            pfVar1 = (float *)(local_118 + lVar25 * 4);
            auVar53._0_4_ = fVar4 * *pfVar1;
            auVar53._4_4_ = fVar5 * pfVar1[1];
            auVar53._8_4_ = fVar14 * pfVar1[2];
            auVar53._12_4_ = fVar10 * pfVar1[3];
            pfVar1 = (float *)(local_118 + 0x10 + lVar25 * 4);
            auVar62._0_4_ = fVar4 * *pfVar1;
            auVar62._4_4_ = fVar5 * pfVar1[1];
            auVar62._8_4_ = fVar14 * pfVar1[2];
            auVar62._12_4_ = fVar10 * pfVar1[3];
            auVar98 = vunpcklps_avx(auVar53,auVar62);
            auVar72 = vunpckhps_avx(auVar53,auVar62);
            auVar50 = vandps_avx(auVar98,auVar46);
            auVar52 = vandps_avx(auVar72,auVar46);
            auVar50 = vorps_avx(auVar50,auVar48);
            auVar52 = vorps_avx(auVar52,auVar48);
            auVar63._0_4_ = (int)(auVar98._0_4_ + auVar50._0_4_);
            auVar63._4_4_ = (int)(auVar98._4_4_ + auVar50._4_4_);
            auVar63._8_4_ = (int)(auVar98._8_4_ + auVar50._8_4_);
            auVar63._12_4_ = (int)(auVar98._12_4_ + auVar50._12_4_);
            auVar54._0_4_ = (int)(auVar52._0_4_ + auVar72._0_4_);
            auVar54._4_4_ = (int)(auVar52._4_4_ + auVar72._4_4_);
            auVar54._8_4_ = (int)(auVar52._8_4_ + auVar72._8_4_);
            auVar54._12_4_ = (int)(auVar52._12_4_ + auVar72._12_4_);
            auVar50 = vpackssdw_avx(auVar63,auVar54);
            auVar50 = vpminsw_avx(auVar50,auVar44);
            auVar50 = vpmaxsw_avx(auVar50,auVar45);
            auVar50 = vpacksswb_avx(auVar50,auVar50);
            *(long *)((long)puVar41 + lVar25) = auVar50._0_8_;
            pfVar31 = pfVar31 + 8;
            lVar25 = lVar25 + 8;
          }
          puVar41 = (undefined8 *)((long)puVar41 + lVar25);
          for (; iVar28 < max_kk; iVar28 = iVar28 + 1) {
            auVar57._0_4_ = fVar4 * *pfVar31;
            auVar57._4_4_ = fVar5 * pfVar31[1];
            auVar57._8_4_ = fVar14 * pfVar31[2];
            auVar57._12_4_ = fVar10 * pfVar31[3];
            auVar50 = vandps_avx(auVar57,auVar46);
            auVar50 = vorps_avx(auVar50,auVar48);
            auVar58._0_4_ = (int)(auVar57._0_4_ + auVar50._0_4_);
            auVar58._4_4_ = (int)(auVar57._4_4_ + auVar50._4_4_);
            auVar58._8_4_ = (int)(auVar57._8_4_ + auVar50._8_4_);
            auVar58._12_4_ = (int)(auVar57._12_4_ + auVar50._12_4_);
            auVar50 = vpackssdw_avx(auVar58,auVar58);
            auVar50 = vpminsw_avx(auVar50,auVar44);
            auVar50 = vpmaxsw_avx(auVar50,auVar45);
            auVar50 = vpacksswb_avx(auVar50,auVar50);
            *(int *)puVar41 = auVar50._0_4_;
            puVar41 = (undefined8 *)((long)puVar41 + 4);
            pfVar31 = pfVar31 + 4;
          }
        }
        if (iVar21 == 1) {
          lVar25 = 0;
          for (iVar28 = 0; iVar28 + 1 < max_kk; iVar28 = iVar28 + 2) {
            auVar50 = vinsertps_avx(ZEXT416(*(uint *)((long)pfVar31 + lVar25)),
                                    ZEXT416(*(uint *)((long)pfVar31 + lVar25 + lVar3)),0x10);
            auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)((long)pfVar31 + lVar25 + lVar2)),0x20)
            ;
            auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)((long)pfVar31 + lVar25 + lVar7)),0x30)
            ;
            auVar52 = vinsertps_avx(ZEXT416(*(uint *)((long)pfVar31 + lVar25 + 4)),
                                    ZEXT416(*(uint *)((long)pfVar31 + lVar25 + lVar6)),0x10);
            auVar52 = vinsertps_avx(auVar52,ZEXT416(*(uint *)((long)pfVar31 + lVar25 + lVar2 + 4)),
                                    0x20);
            auVar52 = vinsertps_avx(auVar52,ZEXT416(*(uint *)((long)pfVar31 + lVar25 + lVar38)),0x30
                                   );
            auVar55._0_4_ = auVar50._0_4_ * fVar4;
            auVar55._4_4_ = auVar50._4_4_ * fVar5;
            auVar55._8_4_ = auVar50._8_4_ * fVar14;
            auVar55._12_4_ = auVar50._12_4_ * fVar10;
            auVar64._0_4_ = auVar52._0_4_ * fVar4;
            auVar64._4_4_ = auVar52._4_4_ * fVar5;
            auVar64._8_4_ = auVar52._8_4_ * fVar14;
            auVar64._12_4_ = auVar52._12_4_ * fVar10;
            auVar98 = vunpcklps_avx(auVar55,auVar64);
            auVar72 = vunpckhps_avx(auVar55,auVar64);
            auVar50 = vandps_avx(auVar98,auVar46);
            auVar52 = vandps_avx(auVar72,auVar46);
            auVar50 = vorps_avx(auVar50,auVar48);
            auVar52 = vorps_avx(auVar52,auVar48);
            auVar65._0_4_ = (int)(auVar98._0_4_ + auVar50._0_4_);
            auVar65._4_4_ = (int)(auVar98._4_4_ + auVar50._4_4_);
            auVar65._8_4_ = (int)(auVar98._8_4_ + auVar50._8_4_);
            auVar65._12_4_ = (int)(auVar98._12_4_ + auVar50._12_4_);
            auVar56._0_4_ = (int)(auVar52._0_4_ + auVar72._0_4_);
            auVar56._4_4_ = (int)(auVar52._4_4_ + auVar72._4_4_);
            auVar56._8_4_ = (int)(auVar52._8_4_ + auVar72._8_4_);
            auVar56._12_4_ = (int)(auVar52._12_4_ + auVar72._12_4_);
            auVar50 = vpackssdw_avx(auVar65,auVar56);
            auVar50 = vpminsw_avx(auVar50,auVar44);
            auVar50 = vpmaxsw_avx(auVar50,auVar45);
            auVar50 = vpacksswb_avx(auVar50,auVar50);
            *(long *)((long)puVar41 + lVar25) = auVar50._0_8_;
            lVar25 = lVar25 + 8;
          }
          for (; iVar28 < max_kk; iVar28 = iVar28 + 1) {
            auVar50 = vinsertps_avx(ZEXT416(*(uint *)((long)pfVar31 + lVar25)),
                                    ZEXT416(*(uint *)((long)pfVar31 + lVar25 + lVar3)),0x10);
            auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)((long)pfVar31 + lVar25 + lVar29)),0x20
                                   );
            auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)((long)pfVar31 + lVar25 + lVar7)),0x30)
            ;
            auVar59._0_4_ = auVar50._0_4_ * fVar4;
            auVar59._4_4_ = auVar50._4_4_ * fVar5;
            auVar59._8_4_ = auVar50._8_4_ * fVar14;
            auVar59._12_4_ = auVar50._12_4_ * fVar10;
            auVar50 = vandps_avx(auVar59,auVar46);
            auVar50 = vorps_avx(auVar50,auVar48);
            auVar60._0_4_ = (int)(auVar59._0_4_ + auVar50._0_4_);
            auVar60._4_4_ = (int)(auVar59._4_4_ + auVar50._4_4_);
            auVar60._8_4_ = (int)(auVar59._8_4_ + auVar50._8_4_);
            auVar60._12_4_ = (int)(auVar59._12_4_ + auVar50._12_4_);
            auVar50 = vpackssdw_avx(auVar60,auVar60);
            auVar50 = vpminsw_avx(auVar50,auVar44);
            auVar50 = vpmaxsw_avx(auVar50,auVar45);
            auVar50 = vpacksswb_avx(auVar50,auVar50);
            *(int *)((long)puVar41 + lVar25) = auVar50._0_4_;
            lVar25 = lVar25 + 4;
          }
          puVar41 = (undefined8 *)((long)puVar41 + lVar25);
        }
        lVar34 = lVar34 + lVar43;
        lVar36 = lVar36 + lVar43;
        local_118 = local_118 + lVar43;
      }
      auVar51._8_4_ = 0x3effffff;
      auVar51._0_8_ = 0x3effffff3effffff;
      auVar51._12_4_ = 0x3effffff;
      for (; (long)(uVar39 | 1) < lVar26; uVar39 = uVar39 + 2) {
        pvVar8 = A->data;
        lVar43 = lVar40 + uVar39;
        fVar4 = *(float *)((long)scales->data + lVar43 * 4);
        auVar61._4_4_ = fVar4;
        auVar61._0_4_ = fVar4;
        auVar61._8_4_ = fVar4;
        auVar61._12_4_ = fVar4;
        fVar5 = *(float *)((long)scales->data + lVar43 * 4 + 4);
        auVar66._4_4_ = fVar5;
        auVar66._0_4_ = fVar5;
        auVar66._8_4_ = fVar5;
        auVar66._12_4_ = fVar5;
        pfVar31 = (float *)((long)pvVar8 + lVar33 * 4 + lVar43 * lVar23 * 4);
        puVar37 = puVar41;
        for (lVar43 = 0; (int)lVar43 + 3 < max_kk; lVar43 = lVar43 + 4) {
          auVar69._0_4_ = fVar4 * *pfVar31;
          auVar69._4_4_ = fVar4 * pfVar31[1];
          auVar69._8_4_ = fVar4 * pfVar31[2];
          auVar69._12_4_ = fVar4 * pfVar31[3];
          pfVar1 = (float *)((long)pvVar8 + lVar43 * 4 + lVar36);
          auVar78._0_4_ = fVar5 * *pfVar1;
          auVar78._4_4_ = fVar5 * pfVar1[1];
          auVar78._8_4_ = fVar5 * pfVar1[2];
          auVar78._12_4_ = fVar5 * pfVar1[3];
          auVar72 = vmovlhps_avx(auVar69,auVar78);
          auVar98 = vunpckhpd_avx(auVar69,auVar78);
          auVar50 = vandps_avx(auVar72,auVar46);
          auVar52 = vandps_avx(auVar98,auVar46);
          auVar50 = vorps_avx(auVar50,auVar48);
          auVar52 = vorps_avx(auVar52,auVar48);
          auVar79._0_4_ = (int)(auVar50._0_4_ + auVar72._0_4_);
          auVar79._4_4_ = (int)(auVar50._4_4_ + auVar72._4_4_);
          auVar79._8_4_ = (int)(auVar50._8_4_ + auVar72._8_4_);
          auVar79._12_4_ = (int)(auVar50._12_4_ + auVar72._12_4_);
          auVar70._0_4_ = (int)(auVar52._0_4_ + auVar98._0_4_);
          auVar70._4_4_ = (int)(auVar52._4_4_ + auVar98._4_4_);
          auVar70._8_4_ = (int)(auVar52._8_4_ + auVar98._8_4_);
          auVar70._12_4_ = (int)(auVar52._12_4_ + auVar98._12_4_);
          auVar50 = vpackssdw_avx(auVar79,auVar70);
          auVar50 = vpminsw_avx(auVar50,auVar44);
          auVar50 = vpmaxsw_avx(auVar50,auVar45);
          auVar50 = vpacksswb_avx(auVar50,auVar50);
          *puVar37 = auVar50._0_8_;
          puVar37 = puVar37 + 1;
          pfVar31 = pfVar31 + 4;
        }
        auVar50 = vmovlhps_avx(auVar61,auVar66);
        for (; (int)lVar43 + 1 < max_kk; lVar43 = lVar43 + 2) {
          auVar80._8_8_ = 0;
          auVar80._0_8_ = *(ulong *)((long)pvVar8 + lVar43 * 4 + lVar36);
          auVar101._8_8_ = 0;
          auVar101._0_8_ = *(ulong *)((long)pvVar8 + lVar43 * 4 + lVar34);
          auVar52 = vmovlhps_avx(auVar101,auVar80);
          auVar81._0_4_ = auVar52._0_4_ * auVar50._0_4_;
          auVar81._4_4_ = auVar52._4_4_ * auVar50._4_4_;
          auVar81._8_4_ = auVar52._8_4_ * auVar50._8_4_;
          auVar81._12_4_ = auVar52._12_4_ * auVar50._12_4_;
          auVar52 = vandps_avx(auVar81,auVar46);
          auVar52 = vorps_avx(auVar52,auVar48);
          auVar82._0_4_ = (int)(auVar81._0_4_ + auVar52._0_4_);
          auVar82._4_4_ = (int)(auVar81._4_4_ + auVar52._4_4_);
          auVar82._8_4_ = (int)(auVar81._8_4_ + auVar52._8_4_);
          auVar82._12_4_ = (int)(auVar81._12_4_ + auVar52._12_4_);
          auVar52 = vpackssdw_avx(auVar82,auVar82);
          auVar52 = vpminsw_avx(auVar52,auVar44);
          auVar52 = vpmaxsw_avx(auVar52,auVar45);
          auVar52 = vpacksswb_avx(auVar52,auVar52);
          *(int *)((long)puVar41 + lVar43 * 2) = auVar52._0_4_;
          puVar37 = (undefined8 *)((long)puVar37 + 4);
        }
        for (; (int)lVar43 < max_kk; lVar43 = lVar43 + 1) {
          fVar14 = fVar4 * *(float *)((long)pvVar8 + lVar43 * 4 + lVar34);
          auVar50 = vandps_avx(ZEXT416((uint)fVar14),auVar46);
          auVar50 = vorps_avx(auVar50,auVar51);
          auVar50 = ZEXT416((uint)(auVar50._0_4_ + fVar14));
          auVar50 = vroundss_avx(auVar50,auVar50,0xb);
          iVar21 = (int)auVar50._0_4_;
          if ((int)auVar50._0_4_ < -0x7e) {
            iVar21 = -0x7f;
          }
          if (0x7e < iVar21) {
            iVar21 = 0x7f;
          }
          *(char *)puVar37 = (char)iVar21;
          fVar14 = fVar5 * *(float *)((long)pvVar8 + lVar43 * 4 + lVar36);
          auVar50 = vandps_avx(ZEXT416((uint)fVar14),auVar46);
          auVar50 = vorps_avx(auVar50,auVar51);
          auVar50 = ZEXT416((uint)(auVar50._0_4_ + fVar14));
          auVar50 = vroundss_avx(auVar50,auVar50,0xb);
          iVar21 = (int)auVar50._0_4_;
          if ((int)auVar50._0_4_ < -0x7e) {
            iVar21 = -0x7f;
          }
          if (0x7e < iVar21) {
            iVar21 = 0x7f;
          }
          *(char *)((long)puVar37 + 1) = (char)iVar21;
          puVar37 = (undefined8 *)((long)puVar37 + 2);
        }
        lVar34 = lVar34 + lVar23 * 8;
        lVar36 = lVar36 + lVar23 * 8;
        puVar41 = puVar37;
      }
      for (; (long)uVar39 < lVar26; uVar39 = uVar39 + 1) {
        pvVar8 = A->data;
        fVar4 = *(float *)((long)scales->data + (lVar40 + uVar39) * 4);
        pfVar31 = (float *)((long)pvVar8 + lVar33 * 4 + (lVar40 + uVar39) * lVar23 * 4);
        for (lVar36 = 0; (int)lVar36 + 3 < max_kk; lVar36 = lVar36 + 4) {
          auVar67._0_4_ = fVar4 * *pfVar31;
          auVar67._4_4_ = fVar4 * pfVar31[1];
          auVar67._8_4_ = fVar4 * pfVar31[2];
          auVar67._12_4_ = fVar4 * pfVar31[3];
          auVar50 = vandps_avx(auVar67,auVar46);
          auVar50 = vorps_avx(auVar50,auVar48);
          auVar68._0_4_ = (int)(auVar67._0_4_ + auVar50._0_4_);
          auVar68._4_4_ = (int)(auVar67._4_4_ + auVar50._4_4_);
          auVar68._8_4_ = (int)(auVar67._8_4_ + auVar50._8_4_);
          auVar68._12_4_ = (int)(auVar67._12_4_ + auVar50._12_4_);
          auVar50 = vpackssdw_avx(auVar68,auVar68);
          auVar50 = vpminsw_avx(auVar50,auVar44);
          auVar50 = vpmaxsw_avx(auVar50,auVar45);
          auVar50 = vpacksswb_avx(auVar50,auVar50);
          *(int *)((long)puVar41 + lVar36) = auVar50._0_4_;
          pfVar31 = pfVar31 + 4;
        }
        for (; (int)lVar36 < max_kk; lVar36 = lVar36 + 1) {
          fVar5 = fVar4 * *(float *)((long)pvVar8 + lVar36 * 4 + lVar34);
          auVar50 = vandps_avx(ZEXT416((uint)fVar5),auVar46);
          auVar50 = vorps_avx(auVar50,auVar51);
          auVar50 = ZEXT416((uint)(fVar5 + auVar50._0_4_));
          auVar50 = vroundss_avx(auVar50,auVar50,0xb);
          iVar21 = (int)auVar50._0_4_;
          if (iVar21 < -0x7e) {
            iVar21 = -0x7f;
          }
          if (0x7e < iVar21) {
            iVar21 = 0x7f;
          }
          *(char *)((long)puVar41 + lVar36) = (char)iVar21;
        }
        lVar34 = lVar34 + lVar3;
        puVar41 = (undefined8 *)((long)puVar41 + lVar36);
      }
    }
    else {
      pack_A_tile_fp32_to_int8_avx2(A,AT,i,max_ii,k,max_kk,scales);
    }
  }
  else {
    pack_A_tile_fp32_to_int8_avxvnni(A,AT,i,max_ii,k,max_kk,scales);
  }
  return;
}

Assistant:

static void pack_A_tile_quantize(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk, const Mat& scales)
{
    pack_A_tile_fp32_to_int8(A, AT, i, max_ii, k, max_kk, scales);
}